

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

VarId pop(void)

{
  undefined8 extraout_RDX;
  VarId *in_RDI;
  VarId VVar1;
  VarId *a;
  Displayable this;
  
  this._vptr_Displayable = (_func_int **)in_RDI;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::back
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)in_RDI);
  mir::inst::VarId::VarId((VarId *)this._vptr_Displayable,in_RDI);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_back
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x280499);
  VVar1._8_8_ = extraout_RDX;
  VVar1.super_Displayable._vptr_Displayable = this._vptr_Displayable;
  return VVar1;
}

Assistant:

mir::inst::VarId pop() {
  mir::inst::VarId a = V.back();
  V.pop_back();
  return a;
}